

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O1

void * __thiscall
PoolResource<48UL,_8UL>::Allocate(PoolResource<48UL,_8UL> *this,size_t bytes,size_t alignment)

{
  long lVar1;
  ListNode *__old_val;
  void *pvVar2;
  ListNode *pLVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bytes < 0x31 && alignment < 9) {
    lVar4 = (bytes + 7 >> 3) + (ulong)(bytes == 0);
    pLVar3 = (this->m_free_lists)._M_elems[lVar4];
    if (pLVar3 == (ListNode *)0x0) {
      if ((long)this->m_available_memory_end - (long)this->m_available_memory_it < lVar4 * 8) {
        AllocateChunk(this);
      }
      pLVar3 = (ListNode *)this->m_available_memory_it;
      this->m_available_memory_it = (byte *)(pLVar3 + lVar4);
    }
    else {
      (this->m_free_lists)._M_elems[lVar4] = pLVar3->m_next;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pLVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pvVar2 = operator_new(bytes,alignment);
    return pvVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static constexpr bool IsFreeListUsable(std::size_t bytes, std::size_t alignment)
    {
        return alignment <= ELEM_ALIGN_BYTES && bytes <= MAX_BLOCK_SIZE_BYTES;
    }